

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  RTCRayQueryContext *pRVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined8 uVar15;
  undefined8 uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  byte bVar19;
  int iVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  float *vertices;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong unaff_R13;
  size_t mask;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  Scene *scene;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined4 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined8 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  UVIdentity<4> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2681;
  RayHit *local_2680;
  RayQueryContext *local_2678;
  ulong local_2670;
  ulong local_2668;
  int local_265c;
  undefined1 local_2658 [16];
  long local_2648;
  long local_2640;
  long local_2638;
  long local_2630;
  long local_2628;
  long local_2620;
  ulong local_2618;
  ulong *local_2610;
  long local_2608;
  long local_2600;
  RTCFilterFunctionNArguments local_25f8;
  float local_25c8;
  float local_25c4;
  float local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  undefined4 local_25b4;
  uint local_25b0;
  uint local_25ac;
  uint local_25a8;
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined1 local_2588 [32];
  undefined1 local_2568 [32];
  undefined1 local_2548 [32];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 *local_24f8;
  byte local_24f0;
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  float local_2498 [4];
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  float fVar2;
  float fVar3;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar7 = (ray->super_RayK<1>).dir.field_0;
      auVar41 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar93 = ZEXT1664(auVar41);
      auVar42 = vmaxss_avx512f(auVar41,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar43 = vmaxss_avx512f(auVar41,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx512vl((undefined1  [16])aVar7,auVar44);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      uVar40 = vcmpps_avx512vl(auVar44,auVar45,1);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar94 = ZEXT1664(auVar44);
      auVar44 = vdivps_avx512vl(auVar44,(undefined1  [16])aVar7);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar12 = (bool)((byte)uVar40 & 1);
      auVar50._0_4_ = (uint)bVar12 * auVar45._0_4_ | (uint)!bVar12 * auVar44._0_4_;
      bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * auVar44._4_4_;
      bVar12 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * auVar44._8_4_;
      bVar12 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar12 * auVar45._12_4_ | (uint)!bVar12 * auVar44._12_4_;
      auVar46._8_4_ = 0x3f7ffffa;
      auVar46._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar46._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar50,auVar46);
      auVar48._8_4_ = 0x3f800003;
      auVar48._0_8_ = 0x3f8000033f800003;
      auVar48._12_4_ = 0x3f800003;
      auVar46 = vmulps_avx512vl(auVar50,auVar48);
      local_2548 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar95 = ZEXT3264(local_2548);
      local_2610 = local_2368;
      local_2568 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar96 = ZEXT3264(local_2568);
      local_2588 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar97 = ZEXT3264(local_2588);
      auVar45 = vucomiss_avx512f(auVar41);
      uVar75 = auVar45._0_4_;
      local_23b8._4_4_ = uVar75;
      local_23b8._0_4_ = uVar75;
      local_23b8._8_4_ = uVar75;
      local_23b8._12_4_ = uVar75;
      local_23b8._16_4_ = uVar75;
      local_23b8._20_4_ = uVar75;
      local_23b8._24_4_ = uVar75;
      local_23b8._28_4_ = uVar75;
      auVar83 = ZEXT3264(local_23b8);
      auVar44 = vmovshdup_avx(auVar45);
      uVar80 = auVar44._0_8_;
      local_23d8._8_8_ = uVar80;
      local_23d8._0_8_ = uVar80;
      local_23d8._16_8_ = uVar80;
      local_23d8._24_8_ = uVar80;
      auVar85 = ZEXT3264(local_23d8);
      vshufpd_avx(auVar45,auVar45,1);
      auVar65._8_4_ = 2;
      auVar65._0_8_ = 0x200000002;
      auVar65._12_4_ = 2;
      auVar65._16_4_ = 2;
      auVar65._20_4_ = 2;
      auVar65._24_4_ = 2;
      auVar65._28_4_ = 2;
      local_23f8 = vpermps_avx2(auVar65,ZEXT1632(auVar45));
      auVar86 = ZEXT3264(local_23f8);
      uVar75 = auVar46._0_4_;
      local_2418._4_4_ = uVar75;
      local_2418._0_4_ = uVar75;
      local_2418._8_4_ = uVar75;
      local_2418._12_4_ = uVar75;
      local_2418._16_4_ = uVar75;
      local_2418._20_4_ = uVar75;
      local_2418._24_4_ = uVar75;
      local_2418._28_4_ = uVar75;
      auVar87 = ZEXT3264(local_2418);
      auVar64._8_4_ = 1;
      auVar64._0_8_ = 0x100000001;
      auVar64._12_4_ = 1;
      auVar64._16_4_ = 1;
      auVar64._20_4_ = 1;
      auVar64._24_4_ = 1;
      auVar64._28_4_ = 1;
      local_2438 = vpermps_avx2(auVar64,ZEXT1632(auVar46));
      auVar88 = ZEXT3264(local_2438);
      local_2458 = vpermps_avx2(auVar65,ZEXT1632(auVar46));
      auVar89 = ZEXT3264(local_2458);
      vucomiss_avx512f(auVar41);
      vucomiss_avx512f(auVar41);
      uVar75 = auVar42._0_4_;
      local_2478._4_4_ = uVar75;
      local_2478._0_4_ = uVar75;
      local_2478._8_4_ = uVar75;
      local_2478._12_4_ = uVar75;
      local_2478._16_4_ = uVar75;
      local_2478._20_4_ = uVar75;
      local_2478._24_4_ = uVar75;
      local_2478._28_4_ = uVar75;
      auVar90 = ZEXT3264(local_2478);
      uVar75 = auVar43._0_4_;
      auVar77 = ZEXT3264(CONCAT428(uVar75,CONCAT424(uVar75,CONCAT420(uVar75,CONCAT416(uVar75,
                                                  CONCAT412(uVar75,CONCAT48(uVar75,CONCAT44(uVar75,
                                                  uVar75))))))));
      auVar64 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar91 = ZEXT3264(auVar64);
      auVar64 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar92 = ZEXT3264(auVar64);
      local_2620 = 0;
      local_2628 = 0x40;
      local_2630 = 0x80;
      local_2638 = 0x20;
      local_2640 = 0x60;
      local_2648 = 0xa0;
      lVar27 = 0x20;
      lVar26 = 0;
      lVar22 = 0x40;
      lVar32 = 0x80;
      lVar36 = 0x60;
      lVar38 = 0xa0;
      local_2680 = ray;
      local_2678 = context;
      do {
        do {
          do {
            if (local_2610 == &local_2378) {
              return;
            }
            pfVar4 = (float *)(local_2610 + -1);
            local_2610 = local_2610 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar4);
          uVar40 = *local_2610;
          do {
            auVar64 = auVar90._0_32_;
            if ((uVar40 & 8) == 0) {
              uVar21 = uVar40 & 0xfffffffffffffff0;
              uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar69._4_4_ = uVar75;
              auVar69._0_4_ = uVar75;
              auVar69._8_4_ = uVar75;
              auVar69._12_4_ = uVar75;
              auVar69._16_4_ = uVar75;
              auVar69._20_4_ = uVar75;
              auVar69._24_4_ = uVar75;
              auVar69._28_4_ = uVar75;
              auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar26),auVar69,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + lVar26));
              auVar65 = vsubps_avx512vl(ZEXT1632(auVar44),auVar95._0_32_);
              auVar66._4_4_ = auVar83._4_4_ * auVar65._4_4_;
              auVar66._0_4_ = auVar83._0_4_ * auVar65._0_4_;
              auVar66._8_4_ = auVar83._8_4_ * auVar65._8_4_;
              auVar66._12_4_ = auVar83._12_4_ * auVar65._12_4_;
              auVar66._16_4_ = auVar83._16_4_ * auVar65._16_4_;
              auVar66._20_4_ = auVar83._20_4_ * auVar65._20_4_;
              auVar66._24_4_ = auVar83._24_4_ * auVar65._24_4_;
              auVar66._28_4_ = auVar65._28_4_;
              auVar65 = vmaxps_avx(auVar64,auVar66);
              auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar22),auVar69,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + lVar22));
              auVar66 = vsubps_avx512vl(ZEXT1632(auVar44),auVar96._0_32_);
              auVar67._4_4_ = auVar85._4_4_ * auVar66._4_4_;
              auVar67._0_4_ = auVar85._0_4_ * auVar66._0_4_;
              auVar67._8_4_ = auVar85._8_4_ * auVar66._8_4_;
              auVar67._12_4_ = auVar85._12_4_ * auVar66._12_4_;
              auVar67._16_4_ = auVar85._16_4_ * auVar66._16_4_;
              auVar67._20_4_ = auVar85._20_4_ * auVar66._20_4_;
              auVar67._24_4_ = auVar85._24_4_ * auVar66._24_4_;
              auVar67._28_4_ = auVar66._28_4_;
              auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar32),auVar69,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + lVar32));
              auVar66 = vsubps_avx512vl(ZEXT1632(auVar44),auVar97._0_32_);
              auVar68._4_4_ = auVar86._4_4_ * auVar66._4_4_;
              auVar68._0_4_ = auVar86._0_4_ * auVar66._0_4_;
              auVar68._8_4_ = auVar86._8_4_ * auVar66._8_4_;
              auVar68._12_4_ = auVar86._12_4_ * auVar66._12_4_;
              auVar68._16_4_ = auVar86._16_4_ * auVar66._16_4_;
              auVar68._20_4_ = auVar86._20_4_ * auVar66._20_4_;
              auVar68._24_4_ = auVar86._24_4_ * auVar66._24_4_;
              auVar68._28_4_ = auVar66._28_4_;
              auVar66 = vmaxps_avx(auVar67,auVar68);
              auVar67 = vmaxps_avx512vl(auVar65,auVar66);
              in_ZMM18 = ZEXT3264(auVar67);
              auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar27),auVar69,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + lVar27));
              auVar65 = vsubps_avx512vl(ZEXT1632(auVar44),auVar95._0_32_);
              auVar73._4_4_ = auVar87._4_4_ * auVar65._4_4_;
              auVar73._0_4_ = auVar87._0_4_ * auVar65._0_4_;
              auVar73._8_4_ = auVar87._8_4_ * auVar65._8_4_;
              auVar73._12_4_ = auVar87._12_4_ * auVar65._12_4_;
              auVar73._16_4_ = auVar87._16_4_ * auVar65._16_4_;
              auVar73._20_4_ = auVar87._20_4_ * auVar65._20_4_;
              auVar73._24_4_ = auVar87._24_4_ * auVar65._24_4_;
              auVar73._28_4_ = auVar65._28_4_;
              auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar36),auVar69,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + lVar36));
              auVar65 = vsubps_avx512vl(ZEXT1632(auVar44),auVar96._0_32_);
              auVar13._4_4_ = auVar88._4_4_ * auVar65._4_4_;
              auVar13._0_4_ = auVar88._0_4_ * auVar65._0_4_;
              auVar13._8_4_ = auVar88._8_4_ * auVar65._8_4_;
              auVar13._12_4_ = auVar88._12_4_ * auVar65._12_4_;
              auVar13._16_4_ = auVar88._16_4_ * auVar65._16_4_;
              auVar13._20_4_ = auVar88._20_4_ * auVar65._20_4_;
              auVar13._24_4_ = auVar88._24_4_ * auVar65._24_4_;
              auVar13._28_4_ = auVar65._28_4_;
              auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + lVar38),auVar69,
                                        *(undefined1 (*) [32])(uVar21 + 0x40 + lVar38));
              auVar65 = vsubps_avx512vl(ZEXT1632(auVar44),auVar97._0_32_);
              auVar14._4_4_ = auVar89._4_4_ * auVar65._4_4_;
              auVar14._0_4_ = auVar89._0_4_ * auVar65._0_4_;
              auVar14._8_4_ = auVar89._8_4_ * auVar65._8_4_;
              auVar14._12_4_ = auVar89._12_4_ * auVar65._12_4_;
              auVar14._16_4_ = auVar89._16_4_ * auVar65._16_4_;
              auVar14._20_4_ = auVar89._20_4_ * auVar65._20_4_;
              auVar14._24_4_ = auVar89._24_4_ * auVar65._24_4_;
              auVar14._28_4_ = auVar65._28_4_;
              auVar65 = vminps_avx(auVar13,auVar14);
              auVar66 = vminps_avx(auVar77._0_32_,auVar73);
              auVar65 = vminps_avx(auVar66,auVar65);
              if (((uint)uVar40 & 7) == 6) {
                uVar80 = vcmpps_avx512vl(auVar67,auVar65,2);
                uVar15 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [32])(uVar21 + 0x1c0),0xd);
                uVar16 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [32])(uVar21 + 0x1e0),1);
                bVar19 = (byte)uVar80 & (byte)uVar15 & (byte)uVar16;
              }
              else {
                uVar80 = vcmpps_avx512vl(auVar67,auVar65,2);
                bVar19 = (byte)uVar80;
              }
              unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)bVar19);
            }
            if ((uVar40 & 8) == 0) {
              if (unaff_R13 == 0) {
                iVar20 = 4;
              }
              else {
                auVar65 = *(undefined1 (*) [32])(uVar40 & 0xfffffffffffffff0);
                auVar66 = ((undefined1 (*) [32])(uVar40 & 0xfffffffffffffff0))[1];
                auVar73 = in_ZMM18._0_32_;
                auVar67 = vpternlogd_avx512vl(auVar91._0_32_,auVar73,auVar92._0_32_,0xf8);
                uVar40 = unaff_R13 & 0xffffffff;
                auVar68 = vpcompressd_avx512vl(auVar67);
                bVar12 = (bool)((byte)uVar40 & 1);
                auVar72._0_4_ = (uint)bVar12 * auVar68._0_4_ | (uint)!bVar12 * auVar67._0_4_;
                bVar12 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar72._4_4_ = (uint)bVar12 * auVar68._4_4_ | (uint)!bVar12 * auVar67._4_4_;
                bVar12 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar72._8_4_ = (uint)bVar12 * auVar68._8_4_ | (uint)!bVar12 * auVar67._8_4_;
                bVar12 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar72._12_4_ = (uint)bVar12 * auVar68._12_4_ | (uint)!bVar12 * auVar67._12_4_;
                bVar12 = (bool)((byte)(uVar40 >> 4) & 1);
                auVar72._16_4_ = (uint)bVar12 * auVar68._16_4_ | (uint)!bVar12 * auVar67._16_4_;
                bVar12 = (bool)((byte)(uVar40 >> 5) & 1);
                auVar72._20_4_ = (uint)bVar12 * auVar68._20_4_ | (uint)!bVar12 * auVar67._20_4_;
                bVar12 = (bool)((byte)(uVar40 >> 6) & 1);
                auVar72._24_4_ = (uint)bVar12 * auVar68._24_4_ | (uint)!bVar12 * auVar67._24_4_;
                bVar12 = (bool)((byte)(uVar40 >> 7) & 1);
                auVar72._28_4_ = (uint)bVar12 * auVar68._28_4_ | (uint)!bVar12 * auVar67._28_4_;
                auVar67 = vpermt2q_avx512vl(auVar65,auVar72,auVar66);
                uVar40 = auVar67._0_8_;
                iVar20 = 0;
                uVar21 = unaff_R13 - 1 & unaff_R13;
                if (uVar21 != 0) {
                  auVar67 = vpshufd_avx2(auVar72,0x55);
                  vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                  auVar68 = vpminsd_avx2(auVar72,auVar67);
                  auVar67 = vpmaxsd_avx2(auVar72,auVar67);
                  uVar21 = uVar21 - 1 & uVar21;
                  if (uVar21 == 0) {
                    auVar64 = vpermi2q_avx512vl(auVar68,auVar65,auVar66);
                    uVar40 = auVar64._0_8_;
                    auVar64 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                    *local_2610 = auVar64._0_8_;
                    auVar64 = vpermd_avx512vl(auVar67,auVar73);
                    *(int *)(local_2610 + 1) = auVar64._0_4_;
                    local_2610 = local_2610 + 2;
                  }
                  else {
                    auVar14 = vpshufd_avx2(auVar72,0xaa);
                    vpermt2q_avx512vl(auVar65,auVar14,auVar66);
                    auVar13 = vpminsd_avx2(auVar68,auVar14);
                    auVar68 = vpmaxsd_avx2(auVar68,auVar14);
                    auVar14 = vpminsd_avx2(auVar67,auVar68);
                    auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                    uVar21 = uVar21 - 1 & uVar21;
                    if (uVar21 == 0) {
                      auVar64 = vpermi2q_avx512vl(auVar13,auVar65,auVar66);
                      uVar40 = auVar64._0_8_;
                      auVar64 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                      *local_2610 = auVar64._0_8_;
                      auVar64 = vpermd_avx512vl(auVar67,auVar73);
                      *(int *)(local_2610 + 1) = auVar64._0_4_;
                      auVar64 = vpermt2q_avx512vl(auVar65,auVar14,auVar66);
                      local_2610[2] = auVar64._0_8_;
                      auVar64 = vpermd_avx512vl(auVar14,auVar73);
                      *(int *)(local_2610 + 3) = auVar64._0_4_;
                      local_2610 = local_2610 + 4;
                    }
                    else {
                      auVar69 = vmovdqa64_avx512vl(auVar73);
                      auVar70 = vmovdqa64_avx512vl(auVar92._0_32_);
                      auVar71 = vmovdqa64_avx512vl(auVar91._0_32_);
                      auVar68 = vpshufd_avx2(auVar72,0xff);
                      vpermt2q_avx512vl(auVar65,auVar68,auVar66);
                      auVar73 = vpminsd_avx2(auVar13,auVar68);
                      auVar68 = vpmaxsd_avx2(auVar13,auVar68);
                      auVar13 = vpminsd_avx2(auVar14,auVar68);
                      auVar68 = vpmaxsd_avx2(auVar14,auVar68);
                      auVar14 = vpminsd_avx2(auVar67,auVar68);
                      auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                      uVar21 = uVar21 - 1 & uVar21;
                      auVar44 = auVar93._0_16_;
                      context = local_2678;
                      ray = local_2680;
                      iVar20 = 0;
                      if (uVar21 == 0) {
                        auVar68 = vpermi2q_avx512vl(auVar73,auVar65,auVar66);
                        uVar40 = auVar68._0_8_;
                        auVar68 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                        *local_2610 = auVar68._0_8_;
                        auVar68 = vmovdqa64_avx512vl(auVar69);
                        in_ZMM18 = ZEXT3264(auVar68);
                        auVar67 = vpermd_avx512vl(auVar67,auVar69);
                        *(int *)(local_2610 + 1) = auVar67._0_4_;
                        auVar67 = vpermt2q_avx512vl(auVar65,auVar14,auVar66);
                        local_2610[2] = auVar67._0_8_;
                        auVar67 = vpermd_avx512vl(auVar14,auVar69);
                        *(int *)(local_2610 + 3) = auVar67._0_4_;
                        auVar65 = vpermt2q_avx512vl(auVar65,auVar13,auVar66);
                        local_2610[4] = auVar65._0_8_;
                        auVar65 = vpermd_avx512vl(auVar13,auVar69);
                        *(int *)(local_2610 + 5) = auVar65._0_4_;
                        local_2610 = local_2610 + 6;
                        auVar44 = vxorps_avx512vl(auVar44,auVar44);
                        auVar93 = ZEXT1664(auVar44);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar94 = ZEXT1664(auVar44);
                        auVar95 = ZEXT3264(local_2548);
                        auVar96 = ZEXT3264(local_2568);
                        auVar97 = ZEXT3264(local_2588);
                        auVar83 = ZEXT3264(auVar83._0_32_);
                        auVar85 = ZEXT3264(auVar85._0_32_);
                        auVar86 = ZEXT3264(auVar86._0_32_);
                        auVar87 = ZEXT3264(auVar87._0_32_);
                        auVar88 = ZEXT3264(auVar88._0_32_);
                        auVar89 = ZEXT3264(auVar89._0_32_);
                        auVar90 = ZEXT3264(auVar64);
                        auVar64 = vmovdqa64_avx512vl(auVar71);
                        auVar91 = ZEXT3264(auVar64);
                        auVar64 = vmovdqa64_avx512vl(auVar70);
                        auVar92 = ZEXT3264(auVar64);
                      }
                      else {
                        auVar72 = valignd_avx512vl(auVar72,auVar72,3);
                        auVar68 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                        auVar73 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar68,auVar73);
                        auVar68 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar73 = vpermt2d_avx512vl(auVar73,auVar68,auVar13);
                        auVar73 = vpermt2d_avx512vl(auVar73,auVar68,auVar14);
                        auVar68 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar67 = vpermt2d_avx512vl(auVar73,auVar68,auVar67);
                        auVar90 = ZEXT3264(auVar67);
                        uVar40 = uVar21;
                        do {
                          auVar68 = auVar90._0_32_;
                          auVar79._8_4_ = 1;
                          auVar79._0_8_ = 0x100000001;
                          auVar79._12_4_ = 1;
                          auVar79._16_4_ = 1;
                          auVar79._20_4_ = 1;
                          auVar79._24_4_ = 1;
                          auVar79._28_4_ = 1;
                          auVar67 = vpermd_avx2(auVar79,auVar72);
                          auVar72 = valignd_avx512vl(auVar72,auVar72,1);
                          vpermt2q_avx512vl(auVar65,auVar72,auVar66);
                          uVar40 = uVar40 - 1 & uVar40;
                          uVar80 = vpcmpd_avx512vl(auVar67,auVar68,5);
                          auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                          bVar19 = (byte)uVar80 << 1;
                          auVar68 = valignd_avx512vl(auVar68,auVar68,7);
                          bVar12 = (bool)((byte)uVar80 & 1);
                          auVar74._4_4_ =
                               (uint)bVar12 * auVar68._4_4_ | (uint)!bVar12 * auVar67._4_4_;
                          auVar74._0_4_ = auVar67._0_4_;
                          bVar12 = (bool)(bVar19 >> 2 & 1);
                          auVar74._8_4_ =
                               (uint)bVar12 * auVar68._8_4_ | (uint)!bVar12 * auVar67._8_4_;
                          bVar12 = (bool)(bVar19 >> 3 & 1);
                          auVar74._12_4_ =
                               (uint)bVar12 * auVar68._12_4_ | (uint)!bVar12 * auVar67._12_4_;
                          bVar12 = (bool)(bVar19 >> 4 & 1);
                          auVar74._16_4_ =
                               (uint)bVar12 * auVar68._16_4_ | (uint)!bVar12 * auVar67._16_4_;
                          bVar12 = (bool)(bVar19 >> 5 & 1);
                          auVar74._20_4_ =
                               (uint)bVar12 * auVar68._20_4_ | (uint)!bVar12 * auVar67._20_4_;
                          bVar12 = (bool)(bVar19 >> 6 & 1);
                          auVar74._24_4_ =
                               (uint)bVar12 * auVar68._24_4_ | (uint)!bVar12 * auVar67._24_4_;
                          auVar74._28_4_ =
                               (uint)(bVar19 >> 7) * auVar68._28_4_ |
                               (uint)!(bool)(bVar19 >> 7) * auVar67._28_4_;
                          auVar90 = ZEXT3264(auVar74);
                        } while (uVar40 != 0);
                        lVar25 = POPCOUNT(uVar21) + 3;
                        do {
                          auVar67 = vpermi2q_avx512vl(auVar74,auVar65,auVar66);
                          *local_2610 = auVar67._0_8_;
                          auVar68 = auVar90._0_32_;
                          auVar67 = vpermd_avx512vl(auVar68,auVar69);
                          *(int *)(local_2610 + 1) = auVar67._0_4_;
                          auVar74 = valignd_avx512vl(auVar68,auVar68,1);
                          local_2610 = local_2610 + 2;
                          auVar90 = ZEXT3264(auVar74);
                          lVar25 = lVar25 + -1;
                        } while (lVar25 != 0);
                        auVar65 = vpermt2q_avx512vl(auVar65,auVar74,auVar66);
                        uVar40 = auVar65._0_8_;
                        auVar44 = vxorps_avx512vl(auVar44,auVar44);
                        auVar93 = ZEXT1664(auVar44);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar94 = ZEXT1664(auVar44);
                        auVar95 = ZEXT3264(local_2548);
                        auVar96 = ZEXT3264(local_2568);
                        auVar97 = ZEXT3264(local_2588);
                        auVar83 = ZEXT3264(auVar83._0_32_);
                        auVar85 = ZEXT3264(auVar85._0_32_);
                        auVar86 = ZEXT3264(auVar86._0_32_);
                        auVar87 = ZEXT3264(auVar87._0_32_);
                        auVar88 = ZEXT3264(auVar88._0_32_);
                        auVar89 = ZEXT3264(auVar89._0_32_);
                        auVar90 = ZEXT3264(auVar64);
                        auVar64 = vmovdqa64_avx512vl(auVar71);
                        auVar91 = ZEXT3264(auVar64);
                        auVar64 = vmovdqa64_avx512vl(auVar70);
                        auVar92 = ZEXT3264(auVar64);
                        auVar64 = vmovdqa64_avx512vl(auVar69);
                        in_ZMM18 = ZEXT3264(auVar64);
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar20 = 6;
            }
          } while (iVar20 == 0);
        } while (iVar20 != 6);
        local_2618 = unaff_R13;
        local_2398 = vmovdqu64_avx512vl(in_ZMM18._0_32_);
        local_2608 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_2608 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          pSVar8 = context->scene;
          local_2600 = 0;
          local_2670 = uVar40;
          do {
            lVar22 = local_2600 * 0x50;
            pGVar9 = (pSVar8->geometries).items[*(uint *)(uVar40 + 0x30 + lVar22)].ptr;
            fVar6 = (pGVar9->time_range).lower;
            fVar6 = pGVar9->fnumTimeSegments *
                    (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar6) /
                    ((pGVar9->time_range).upper - fVar6));
            auVar44 = vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),9);
            auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
            auVar47 = vmaxss_avx512f(auVar93._0_16_,auVar44);
            lVar26 = (long)(int)auVar47._0_4_ * 0x38;
            uVar23 = CONCAT44(0,*(uint *)(uVar40 + lVar22));
            local_2658._0_8_ = uVar23;
            local_2668 = (ulong)*(uint *)(uVar40 + 4 + lVar22);
            lVar27 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar26);
            auVar44 = *(undefined1 (*) [16])(lVar27 + uVar23 * 4);
            uVar28 = (ulong)*(uint *)(uVar40 + 0x10 + lVar22);
            auVar45 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
            lVar26 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar26);
            uVar29 = (ulong)*(uint *)(uVar40 + 0x20 + lVar22);
            auVar46 = *(undefined1 (*) [16])(lVar27 + uVar29 * 4);
            auVar48 = *(undefined1 (*) [16])(lVar27 + local_2668 * 4);
            uVar30 = (ulong)*(uint *)(uVar40 + 0x14 + lVar22);
            auVar41 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
            uVar31 = (ulong)*(uint *)(uVar40 + 0x24 + lVar22);
            auVar42 = *(undefined1 (*) [16])(lVar27 + uVar31 * 4);
            uVar33 = (ulong)*(uint *)(uVar40 + 8 + lVar22);
            auVar43 = *(undefined1 (*) [16])(lVar27 + uVar33 * 4);
            uVar21 = (ulong)*(uint *)(uVar40 + 0x18 + lVar22);
            auVar50 = *(undefined1 (*) [16])(lVar27 + uVar21 * 4);
            uVar37 = (ulong)*(uint *)(uVar40 + 0x28 + lVar22);
            auVar59 = *(undefined1 (*) [16])(lVar27 + uVar37 * 4);
            uVar34 = (ulong)*(uint *)(uVar40 + 0xc + lVar22);
            auVar60 = *(undefined1 (*) [16])(lVar27 + uVar34 * 4);
            uVar35 = (ulong)*(uint *)(uVar40 + 0x1c + lVar22);
            auVar61 = *(undefined1 (*) [16])(lVar27 + uVar35 * 4);
            uVar40 = (ulong)*(uint *)(local_2670 + 0x2c + lVar22);
            auVar49 = *(undefined1 (*) [16])(lVar27 + uVar40 * 4);
            auVar51 = *(undefined1 (*) [16])(lVar26 + uVar23 * 4);
            auVar52 = *(undefined1 (*) [16])(lVar26 + uVar28 * 4);
            auVar55 = *(undefined1 (*) [16])(lVar26 + uVar29 * 4);
            auVar53 = *(undefined1 (*) [16])(lVar26 + local_2668 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar26 + uVar30 * 4);
            auVar56 = *(undefined1 (*) [16])(lVar26 + uVar31 * 4);
            auVar57 = *(undefined1 (*) [16])(lVar26 + uVar33 * 4);
            auVar58 = *(undefined1 (*) [16])(lVar26 + uVar21 * 4);
            auVar62 = *(undefined1 (*) [16])(lVar26 + uVar37 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar26 + uVar34 * 4);
            auVar78 = *(undefined1 (*) [16])(lVar26 + uVar35 * 4);
            auVar81 = *(undefined1 (*) [16])(lVar26 + uVar40 * 4);
            puVar5 = (undefined8 *)(local_2670 + 0x30 + lVar22);
            local_2488 = *puVar5;
            uStack_2480 = puVar5[1];
            puVar5 = (undefined8 *)(local_2670 + 0x40 + lVar22);
            auVar82 = vunpcklps_avx(auVar44,auVar43);
            auVar44 = vunpckhps_avx(auVar44,auVar43);
            auVar43 = vunpcklps_avx(auVar48,auVar60);
            auVar48 = vunpckhps_avx(auVar48,auVar60);
            auVar60 = vunpcklps_avx(auVar44,auVar48);
            auVar84 = vunpcklps_avx(auVar82,auVar43);
            auVar44 = vunpckhps_avx(auVar82,auVar43);
            auVar43 = vunpcklps_avx(auVar45,auVar50);
            auVar45 = vunpckhps_avx(auVar45,auVar50);
            auVar50 = vunpcklps_avx(auVar41,auVar61);
            auVar48 = vunpckhps_avx(auVar41,auVar61);
            auVar41 = vunpcklps_avx(auVar45,auVar48);
            auVar61 = vunpcklps_avx(auVar43,auVar50);
            auVar45 = vunpckhps_avx(auVar43,auVar50);
            auVar43 = vunpcklps_avx(auVar46,auVar59);
            auVar46 = vunpckhps_avx(auVar46,auVar59);
            auVar50 = vunpcklps_avx(auVar42,auVar49);
            auVar48 = vunpckhps_avx(auVar42,auVar49);
            auVar42 = vunpcklps_avx(auVar46,auVar48);
            auVar59 = vunpcklps_avx(auVar43,auVar50);
            auVar46 = vunpckhps_avx(auVar43,auVar50);
            auVar48 = vunpcklps_avx512vl(auVar51,auVar57);
            auVar43 = vunpckhps_avx512vl(auVar51,auVar57);
            auVar49 = vunpcklps_avx512vl(auVar53,auVar63);
            auVar50 = vunpckhps_avx512vl(auVar53,auVar63);
            auVar43 = vunpcklps_avx(auVar43,auVar50);
            auVar50 = vunpcklps_avx(auVar48,auVar49);
            auVar48 = vunpckhps_avx(auVar48,auVar49);
            auVar49 = vunpcklps_avx512vl(auVar52,auVar58);
            auVar51 = vunpckhps_avx512vl(auVar52,auVar58);
            auVar52 = vunpcklps_avx512vl(auVar54,auVar78);
            auVar53 = vunpckhps_avx512vl(auVar54,auVar78);
            auVar51 = vunpcklps_avx512vl(auVar51,auVar53);
            auVar53 = vunpcklps_avx512vl(auVar49,auVar52);
            auVar52 = vunpckhps_avx512vl(auVar49,auVar52);
            auVar54 = vunpcklps_avx512vl(auVar55,auVar62);
            auVar49 = vunpckhps_avx512vl(auVar55,auVar62);
            auVar55 = vunpcklps_avx512vl(auVar56,auVar81);
            auVar56 = vunpckhps_avx512vl(auVar56,auVar81);
            auVar49 = vunpcklps_avx(auVar49,auVar56);
            auVar56 = vunpcklps_avx512vl(auVar54,auVar55);
            auVar55 = vunpckhps_avx512vl(auVar54,auVar55);
            auVar57 = ZEXT416((uint)(fVar6 - auVar47._0_4_));
            auVar54 = vbroadcastss_avx512vl(auVar57);
            auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar57);
            auVar62._0_4_ = auVar57._0_4_;
            auVar62._4_4_ = auVar62._0_4_;
            auVar62._8_4_ = auVar62._0_4_;
            auVar62._12_4_ = auVar62._0_4_;
            auVar50 = vmulps_avx512vl(auVar54,auVar50);
            auVar57 = vmulps_avx512vl(auVar54,auVar48);
            auVar58 = vmulps_avx512vl(auVar54,auVar43);
            auVar48 = vfmadd231ps_fma(auVar50,auVar62,auVar84);
            auVar43 = vfmadd231ps_fma(auVar57,auVar62,auVar44);
            auVar50 = vfmadd231ps_fma(auVar58,auVar62,auVar60);
            auVar44 = vmulps_avx512vl(auVar54,auVar53);
            auVar52 = vmulps_avx512vl(auVar54,auVar52);
            auVar51 = vmulps_avx512vl(auVar54,auVar51);
            auVar60 = vfmadd231ps_fma(auVar44,auVar62,auVar61);
            auVar61 = vfmadd231ps_fma(auVar52,auVar62,auVar45);
            auVar51 = vfmadd231ps_avx512vl(auVar51,auVar62,auVar41);
            auVar44 = vmulps_avx512vl(auVar54,auVar56);
            auVar45 = vmulps_avx512vl(auVar54,auVar55);
            auVar49 = vmulps_avx512vl(auVar54,auVar49);
            auVar41 = vfmadd231ps_fma(auVar44,auVar62,auVar59);
            auVar46 = vfmadd231ps_fma(auVar45,auVar62,auVar46);
            local_2598 = *puVar5;
            uStack_2590 = puVar5[1];
            auVar42 = vfmadd231ps_fma(auVar49,auVar62,auVar42);
            local_2681 = 0;
            uVar75 = *(undefined4 *)&(local_2680->super_RayK<1>).org.field_0;
            auVar49._4_4_ = uVar75;
            auVar49._0_4_ = uVar75;
            auVar49._8_4_ = uVar75;
            auVar49._12_4_ = uVar75;
            uVar75 = *(undefined4 *)((long)&(local_2680->super_RayK<1>).org.field_0 + 4);
            auVar52._4_4_ = uVar75;
            auVar52._0_4_ = uVar75;
            auVar52._8_4_ = uVar75;
            auVar52._12_4_ = uVar75;
            auVar59 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_2680->super_RayK<1>).org.field_0.m128[2]));
            uVar75 = *(undefined4 *)&(local_2680->super_RayK<1>).dir.field_0;
            auVar81._4_4_ = uVar75;
            auVar81._0_4_ = uVar75;
            auVar81._8_4_ = uVar75;
            auVar81._12_4_ = uVar75;
            uVar75 = *(undefined4 *)((long)&(local_2680->super_RayK<1>).dir.field_0 + 4);
            auVar82._4_4_ = uVar75;
            auVar82._0_4_ = uVar75;
            auVar82._8_4_ = uVar75;
            auVar82._12_4_ = uVar75;
            local_24f8 = &local_2681;
            fVar6 = (local_2680->super_RayK<1>).dir.field_0.m128[2];
            auVar84._4_4_ = fVar6;
            auVar84._0_4_ = fVar6;
            auVar84._8_4_ = fVar6;
            auVar84._12_4_ = fVar6;
            auVar44 = vsubps_avx(auVar48,auVar49);
            auVar45 = vsubps_avx(auVar43,auVar52);
            auVar43 = vsubps_avx512vl(auVar50,auVar59);
            auVar50 = vsubps_avx512vl(auVar60,auVar49);
            auVar60 = vsubps_avx512vl(auVar61,auVar52);
            auVar61 = vsubps_avx512vl(auVar51,auVar59);
            auVar49 = vsubps_avx512vl(auVar41,auVar49);
            auVar46 = vsubps_avx(auVar46,auVar52);
            auVar42 = vsubps_avx512vl(auVar42,auVar59);
            auVar59 = vsubps_avx512vl(auVar49,auVar44);
            auVar48 = vsubps_avx(auVar46,auVar45);
            auVar51 = vsubps_avx512vl(auVar42,auVar43);
            auVar52 = vsubps_avx512vl(auVar44,auVar50);
            auVar55 = vsubps_avx512vl(auVar45,auVar60);
            auVar53 = vsubps_avx512vl(auVar43,auVar61);
            auVar54 = vsubps_avx512vl(auVar50,auVar49);
            auVar56 = vsubps_avx512vl(auVar60,auVar46);
            auVar57 = vsubps_avx512vl(auVar61,auVar42);
            auVar41 = vaddps_avx512vl(auVar49,auVar44);
            auVar47._0_4_ = auVar46._0_4_ + auVar45._0_4_;
            auVar47._4_4_ = auVar46._4_4_ + auVar45._4_4_;
            auVar47._8_4_ = auVar46._8_4_ + auVar45._8_4_;
            auVar47._12_4_ = auVar46._12_4_ + auVar45._12_4_;
            auVar58 = vaddps_avx512vl(auVar42,auVar43);
            auVar62 = vmulps_avx512vl(auVar47,auVar51);
            auVar62 = vfmsub231ps_avx512vl(auVar62,auVar48,auVar58);
            auVar58 = vmulps_avx512vl(auVar58,auVar59);
            auVar58 = vfmsub231ps_avx512vl(auVar58,auVar51,auVar41);
            auVar63._0_4_ = auVar48._0_4_ * auVar41._0_4_;
            auVar63._4_4_ = auVar48._4_4_ * auVar41._4_4_;
            auVar63._8_4_ = auVar48._8_4_ * auVar41._8_4_;
            auVar63._12_4_ = auVar48._12_4_ * auVar41._12_4_;
            auVar41 = vfmsub231ps_fma(auVar63,auVar59,auVar47);
            auVar78._0_4_ = fVar6 * auVar41._0_4_;
            auVar78._4_4_ = fVar6 * auVar41._4_4_;
            auVar78._8_4_ = fVar6 * auVar41._8_4_;
            auVar78._12_4_ = fVar6 * auVar41._12_4_;
            auVar41 = vfmadd231ps_avx512vl(auVar78,auVar82,auVar58);
            local_2528 = vfmadd231ps_avx512vl(auVar41,auVar81,auVar62);
            auVar41 = vaddps_avx512vl(auVar44,auVar50);
            auVar58 = vaddps_avx512vl(auVar45,auVar60);
            auVar62 = vaddps_avx512vl(auVar43,auVar61);
            auVar63 = vmulps_avx512vl(auVar58,auVar53);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar55,auVar62);
            auVar62 = vmulps_avx512vl(auVar62,auVar52);
            auVar62 = vfmsub231ps_avx512vl(auVar62,auVar53,auVar41);
            auVar41 = vmulps_avx512vl(auVar41,auVar55);
            auVar41 = vfmsub231ps_avx512vl(auVar41,auVar52,auVar58);
            auVar58._0_4_ = fVar6 * auVar41._0_4_;
            auVar58._4_4_ = fVar6 * auVar41._4_4_;
            auVar58._8_4_ = fVar6 * auVar41._8_4_;
            auVar58._12_4_ = fVar6 * auVar41._12_4_;
            auVar41 = vfmadd231ps_avx512vl(auVar58,auVar82,auVar62);
            local_2518 = vfmadd231ps_avx512vl(auVar41,auVar81,auVar63);
            auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar77 = ZEXT1664(auVar58);
            auVar41 = vaddps_avx512vl(auVar50,auVar49);
            auVar46 = vaddps_avx512vl(auVar60,auVar46);
            auVar42 = vaddps_avx512vl(auVar61,auVar42);
            auVar50 = vmulps_avx512vl(auVar46,auVar57);
            auVar50 = vfmsub231ps_avx512vl(auVar50,auVar56,auVar42);
            auVar42 = vmulps_avx512vl(auVar42,auVar54);
            auVar42 = vfmsub231ps_avx512vl(auVar42,auVar57,auVar41);
            auVar41 = vmulps_avx512vl(auVar41,auVar56);
            auVar46 = vfmsub231ps_avx512vl(auVar41,auVar54,auVar46);
            auVar46 = vmulps_avx512vl(auVar84,auVar46);
            auVar46 = vfmadd231ps_avx512vl(auVar46,auVar82,auVar42);
            auVar46 = vfmadd231ps_avx512vl(auVar46,auVar81,auVar50);
            auVar60._0_4_ = local_2518._0_4_ + local_2528._0_4_;
            auVar60._4_4_ = local_2518._4_4_ + local_2528._4_4_;
            auVar60._8_4_ = local_2518._8_4_ + local_2528._8_4_;
            auVar60._12_4_ = local_2518._12_4_ + local_2528._12_4_;
            local_2508 = vaddps_avx512vl(auVar46,auVar60);
            auVar41._8_4_ = 0x7fffffff;
            auVar41._0_8_ = 0x7fffffff7fffffff;
            auVar41._12_4_ = 0x7fffffff;
            auVar41 = vandps_avx512vl(local_2508,auVar41);
            auVar42._8_4_ = 0x34000000;
            auVar42._0_8_ = 0x3400000034000000;
            auVar42._12_4_ = 0x34000000;
            auVar42 = vmulps_avx512vl(auVar41,auVar42);
            auVar50 = vminps_avx512vl(local_2528,local_2518);
            auVar50 = vminps_avx512vl(auVar50,auVar46);
            auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar60 = vxorps_avx512vl(auVar42,auVar60);
            uVar80 = vcmpps_avx512vl(auVar50,auVar60,5);
            auVar50 = vmaxps_avx512vl(local_2528,local_2518);
            auVar46 = vmaxps_avx512vl(auVar50,auVar46);
            uVar15 = vcmpps_avx512vl(auVar46,auVar42,2);
            local_24f0 = ((byte)uVar80 | (byte)uVar15) & 0xf;
            context = local_2678;
            ray = local_2680;
            uVar40 = local_2670;
            if (local_24f0 != 0) {
              auVar46 = vmulps_avx512vl(auVar51,auVar55);
              auVar42 = vmulps_avx512vl(auVar59,auVar53);
              auVar50 = vmulps_avx512vl(auVar48,auVar52);
              auVar60 = vmulps_avx512vl(auVar53,auVar56);
              auVar61 = vmulps_avx512vl(auVar52,auVar57);
              auVar49 = vmulps_avx512vl(auVar55,auVar54);
              auVar48 = vfmsub213ps_avx512vl(auVar48,auVar53,auVar46);
              auVar51 = vfmsub213ps_avx512vl(auVar51,auVar52,auVar42);
              auVar59 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar50);
              auVar55 = vfmsub213ps_avx512vl(auVar57,auVar55,auVar60);
              auVar53 = vfmsub213ps_avx512vl(auVar54,auVar53,auVar61);
              auVar52 = vfmsub213ps_avx512vl(auVar56,auVar52,auVar49);
              auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar46 = vandps_avx512vl(auVar46,auVar54);
              auVar60 = vandps_avx512vl(auVar60,auVar54);
              uVar21 = vcmpps_avx512vl(auVar46,auVar60,1);
              auVar46 = vandps_avx512vl(auVar42,auVar54);
              auVar42 = vandps_avx512vl(auVar61,auVar54);
              uVar23 = vcmpps_avx512vl(auVar46,auVar42,1);
              auVar46 = vandps_avx512vl(auVar50,auVar54);
              auVar42 = vandps_avx512vl(auVar49,auVar54);
              uVar28 = vcmpps_avx512vl(auVar46,auVar42,1);
              bVar12 = (bool)((byte)uVar21 & 1);
              local_24b8._0_4_ = (uint)bVar12 * auVar48._0_4_ | (uint)!bVar12 * auVar55._0_4_;
              bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
              local_24b8._4_4_ = (uint)bVar12 * auVar48._4_4_ | (uint)!bVar12 * auVar55._4_4_;
              bVar12 = (bool)((byte)(uVar21 >> 2) & 1);
              local_24b8._8_4_ = (uint)bVar12 * auVar48._8_4_ | (uint)!bVar12 * auVar55._8_4_;
              bVar12 = (bool)((byte)(uVar21 >> 3) & 1);
              local_24b8._12_4_ = (uint)bVar12 * auVar48._12_4_ | (uint)!bVar12 * auVar55._12_4_;
              bVar12 = (bool)((byte)uVar23 & 1);
              local_24a8._0_4_ = (uint)bVar12 * auVar51._0_4_ | (uint)!bVar12 * auVar53._0_4_;
              bVar12 = (bool)((byte)(uVar23 >> 1) & 1);
              local_24a8._4_4_ = (uint)bVar12 * auVar51._4_4_ | (uint)!bVar12 * auVar53._4_4_;
              bVar12 = (bool)((byte)(uVar23 >> 2) & 1);
              local_24a8._8_4_ = (uint)bVar12 * auVar51._8_4_ | (uint)!bVar12 * auVar53._8_4_;
              bVar12 = (bool)((byte)(uVar23 >> 3) & 1);
              local_24a8._12_4_ = (uint)bVar12 * auVar51._12_4_ | (uint)!bVar12 * auVar53._12_4_;
              bVar12 = (bool)((byte)uVar28 & 1);
              local_2498[0] = (float)((uint)bVar12 * auVar59._0_4_ | (uint)!bVar12 * auVar52._0_4_);
              bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
              local_2498[1] = (float)((uint)bVar12 * auVar59._4_4_ | (uint)!bVar12 * auVar52._4_4_);
              bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
              local_2498[2] = (float)((uint)bVar12 * auVar59._8_4_ | (uint)!bVar12 * auVar52._8_4_);
              bVar12 = (bool)((byte)(uVar28 >> 3) & 1);
              local_2498[3] =
                   (float)((uint)bVar12 * auVar59._12_4_ | (uint)!bVar12 * auVar52._12_4_);
              auVar53._0_4_ = fVar6 * local_2498[0];
              auVar53._4_4_ = fVar6 * local_2498[1];
              auVar53._8_4_ = fVar6 * local_2498[2];
              auVar53._12_4_ = fVar6 * local_2498[3];
              auVar46 = vfmadd213ps_fma(auVar82,local_24a8,auVar53);
              auVar46 = vfmadd213ps_fma(auVar81,local_24b8,auVar46);
              auVar51._0_4_ = auVar46._0_4_ + auVar46._0_4_;
              auVar51._4_4_ = auVar46._4_4_ + auVar46._4_4_;
              auVar51._8_4_ = auVar46._8_4_ + auVar46._8_4_;
              auVar51._12_4_ = auVar46._12_4_ + auVar46._12_4_;
              auVar55._0_4_ = auVar43._0_4_ * local_2498[0];
              auVar55._4_4_ = auVar43._4_4_ * local_2498[1];
              auVar55._8_4_ = auVar43._8_4_ * local_2498[2];
              auVar55._12_4_ = auVar43._12_4_ * local_2498[3];
              auVar45 = vfmadd213ps_fma(auVar45,local_24a8,auVar55);
              auVar45 = vfmadd213ps_fma(auVar44,local_24b8,auVar45);
              auVar44 = vrcp14ps_avx512vl(auVar51);
              auVar48 = auVar94._0_16_;
              auVar46 = vfnmadd213ps_avx512vl(auVar44,auVar51,auVar48);
              auVar44 = vfmadd132ps_fma(auVar46,auVar44,auVar44);
              local_24c8._0_4_ = (auVar45._0_4_ + auVar45._0_4_) * auVar44._0_4_;
              local_24c8._4_4_ = (auVar45._4_4_ + auVar45._4_4_) * auVar44._4_4_;
              local_24c8._8_4_ = (auVar45._8_4_ + auVar45._8_4_) * auVar44._8_4_;
              local_24c8._12_4_ = (auVar45._12_4_ + auVar45._12_4_) * auVar44._12_4_;
              auVar83 = ZEXT1664(local_24c8);
              uVar75 = *(undefined4 *)((long)&(local_2680->super_RayK<1>).org.field_0 + 0xc);
              auVar43._4_4_ = uVar75;
              auVar43._0_4_ = uVar75;
              auVar43._8_4_ = uVar75;
              auVar43._12_4_ = uVar75;
              uVar80 = vcmpps_avx512vl(local_24c8,auVar43,0xd);
              uVar21 = CONCAT44(auVar51._4_4_,auVar51._0_4_);
              auVar61._0_8_ = uVar21 ^ 0x8000000080000000;
              auVar61._8_4_ = -auVar51._8_4_;
              auVar61._12_4_ = -auVar51._12_4_;
              fVar6 = (local_2680->super_RayK<1>).tfar;
              auVar59._4_4_ = fVar6;
              auVar59._0_4_ = fVar6;
              auVar59._8_4_ = fVar6;
              auVar59._12_4_ = fVar6;
              uVar15 = vcmpps_avx512vl(local_24c8,auVar59,2);
              uVar16 = vcmpps_avx512vl(auVar51,auVar61,4);
              local_24f0 = (byte)uVar80 & (byte)uVar15 & (byte)uVar16 & local_24f0;
              uVar39 = (uint)local_24f0;
              if (local_24f0 != 0) {
                auVar54._8_4_ = 0x219392ef;
                auVar54._0_8_ = 0x219392ef219392ef;
                auVar54._12_4_ = 0x219392ef;
                uVar21 = vcmpps_avx512vl(auVar41,auVar54,5);
                auVar44 = vrcp14ps_avx512vl(local_2508);
                auVar45 = vfnmadd213ps_avx512vl(local_2508,auVar44,auVar48);
                auVar44 = vfmadd132ps_avx512vl(auVar45,auVar44,auVar44);
                fVar1 = (float)((uint)((byte)uVar21 & 1) * auVar44._0_4_);
                fVar6 = (float)((uint)((byte)(uVar21 >> 1) & 1) * auVar44._4_4_);
                fVar2 = (float)((uint)((byte)(uVar21 >> 2) & 1) * auVar44._8_4_);
                fVar3 = (float)((uint)((byte)(uVar21 >> 3) & 1) * auVar44._12_4_);
                auVar57._0_4_ = fVar1 * local_2528._0_4_;
                auVar57._4_4_ = fVar6 * local_2528._4_4_;
                auVar57._8_4_ = fVar2 * local_2528._8_4_;
                auVar57._12_4_ = fVar3 * local_2528._12_4_;
                local_24e8 = vminps_avx512vl(auVar57,auVar48);
                auVar76._0_4_ = fVar1 * local_2518._0_4_;
                auVar76._4_4_ = fVar6 * local_2518._4_4_;
                auVar76._8_4_ = fVar2 * local_2518._8_4_;
                auVar76._12_4_ = fVar3 * local_2518._12_4_;
                local_24d8 = vminps_avx512vl(auVar76,auVar48);
                auVar44 = vblendmps_avx512vl(auVar58,local_24c8);
                auVar56._0_4_ =
                     (uint)(local_24f0 & 1) * auVar44._0_4_ |
                     (uint)!(bool)(local_24f0 & 1) * local_24d8._0_4_;
                bVar12 = (bool)(local_24f0 >> 1 & 1);
                auVar56._4_4_ = (uint)bVar12 * auVar44._4_4_ | (uint)!bVar12 * local_24d8._4_4_;
                bVar12 = (bool)(local_24f0 >> 2 & 1);
                auVar56._8_4_ = (uint)bVar12 * auVar44._8_4_ | (uint)!bVar12 * local_24d8._8_4_;
                auVar56._12_4_ =
                     (uint)(local_24f0 >> 3) * auVar44._12_4_ |
                     (uint)!(bool)(local_24f0 >> 3) * local_24d8._12_4_;
                auVar44 = vshufps_avx(auVar56,auVar56,0xb1);
                auVar44 = vminps_avx(auVar44,auVar56);
                auVar45 = vshufpd_avx(auVar44,auVar44,1);
                auVar44 = vminps_avx(auVar45,auVar44);
                uVar80 = vcmpps_avx512vl(auVar56,auVar44,0);
                bVar19 = (byte)uVar80 & local_24f0;
                if (((byte)uVar80 & local_24f0) == 0) {
                  bVar19 = local_24f0;
                }
                uVar21 = 0;
                for (uVar23 = (ulong)bVar19; (uVar23 & 1) == 0;
                    uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                  uVar21 = uVar21 + 1;
                }
                do {
                  auVar45 = auVar93._0_16_;
                  uVar24 = *(uint *)((long)&local_2488 + uVar21 * 4);
                  pGVar9 = (pSVar8->geometries).items[uVar24].ptr;
                  auVar44 = auVar56;
                  if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
                    bVar19 = ~(byte)(1 << ((uint)uVar21 & 0x1f)) & (byte)uVar39;
LAB_01fc551b:
                    uVar39 = (uint)bVar19;
                    bVar12 = true;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_25f8.context = context->user;
                      local_25c8 = *(float *)(local_24b8 + uVar21 * 4);
                      local_25c4 = local_2498[uVar21 - 4];
                      local_25c0 = local_2498[uVar21];
                      local_25bc = *(undefined4 *)(local_24e8 + uVar21 * 4);
                      local_25b8 = *(undefined4 *)(local_24d8 + uVar21 * 4);
                      local_25b4 = *(undefined4 *)((long)&local_2598 + uVar21 * 4);
                      local_25b0 = uVar24;
                      local_25ac = (local_25f8.context)->instID[0];
                      local_25a8 = (local_25f8.context)->instPrimID[0];
                      local_2668 = CONCAT44(local_2668._4_4_,(ray->super_RayK<1>).tfar);
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar21 * 4);
                      local_265c = -1;
                      local_25f8.valid = &local_265c;
                      local_25f8.geometryUserPtr = pGVar9->userPtr;
                      local_25f8.ray = (RTCRayN *)ray;
                      local_25f8.hit = (RTCHitN *)&local_25c8;
                      local_25f8.N = 1;
                      local_2658 = auVar83._0_16_;
                      if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01fc56dd:
                        auVar44 = auVar93._0_16_;
                        if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar10->filter)(&local_25f8);
                            auVar83 = ZEXT1664(local_2658);
                            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar77 = ZEXT1664(auVar45);
                            auVar97 = ZEXT3264(local_2588);
                            auVar96 = ZEXT3264(local_2568);
                            auVar95 = ZEXT3264(local_2548);
                            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar94 = ZEXT1664(auVar45);
                            auVar44 = vxorps_avx512vl(auVar44,auVar44);
                            auVar93 = ZEXT1664(auVar44);
                            context = local_2678;
                            ray = local_2680;
                            uVar40 = local_2670;
                          }
                          if (*local_25f8.valid == 0) goto LAB_01fc57b9;
                        }
                        (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_25f8.hit;
                        (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_25f8.hit + 4);
                        (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_25f8.hit + 8);
                        *(float *)((long)local_25f8.ray + 0x3c) = *(float *)(local_25f8.hit + 0xc);
                        fVar6 = *(float *)(local_25f8.hit + 0x10);
                        *(float *)((long)local_25f8.ray + 0x40) = fVar6;
                        *(float *)((long)local_25f8.ray + 0x44) = *(float *)(local_25f8.hit + 0x14);
                        *(float *)((long)local_25f8.ray + 0x48) = *(float *)(local_25f8.hit + 0x18);
                        *(float *)((long)local_25f8.ray + 0x4c) = *(float *)(local_25f8.hit + 0x1c);
                        *(float *)((long)local_25f8.ray + 0x50) = *(float *)(local_25f8.hit + 0x20);
                        uVar40 = local_2670;
                      }
                      else {
                        (*pGVar9->intersectionFilterN)(&local_25f8);
                        auVar83 = ZEXT1664(local_2658);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar77 = ZEXT1664(auVar44);
                        auVar97 = ZEXT3264(local_2588);
                        auVar96 = ZEXT3264(local_2568);
                        auVar95 = ZEXT3264(local_2548);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar94 = ZEXT1664(auVar44);
                        auVar44 = vxorps_avx512vl(auVar45,auVar45);
                        auVar93 = ZEXT1664(auVar44);
                        context = local_2678;
                        ray = local_2680;
                        uVar40 = local_2670;
                        if (*local_25f8.valid != 0) goto LAB_01fc56dd;
LAB_01fc57b9:
                        (ray->super_RayK<1>).tfar = (float)local_2668;
                        fVar6 = (float)local_2668;
                      }
                      fVar2 = (ray->super_RayK<1>).tfar;
                      auVar18._4_4_ = fVar2;
                      auVar18._0_4_ = fVar2;
                      auVar18._8_4_ = fVar2;
                      auVar18._12_4_ = fVar2;
                      uVar80 = vcmpps_avx512vl(auVar83._0_16_,auVar18,2);
                      bVar19 = ~(byte)(1 << ((uint)uVar21 & 0x1f)) & (byte)uVar39 & (byte)uVar80;
                      auVar44 = ZEXT416((uint)fVar6);
                      goto LAB_01fc551b;
                    }
                    bVar12 = false;
                  }
                  if (!bVar12) {
                    fVar6 = *(float *)(local_24e8 + uVar21 * 4);
                    fVar2 = *(float *)(local_24d8 + uVar21 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar21 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24b8 + uVar21 * 4);
                    (ray->Ng).field_0.field_0.y = local_2498[uVar21 - 4];
                    (ray->Ng).field_0.field_0.z = local_2498[uVar21];
                    ray->u = fVar6;
                    ray->v = fVar2;
                    ray->primID = *(uint *)((long)&local_2598 + uVar21 * 4);
                    ray->geomID = uVar24;
                    pRVar11 = context->user;
                    ray->instID[0] = pRVar11->instID[0];
                    ray->instPrimID[0] = pRVar11->instPrimID[0];
                    break;
                  }
                  bVar19 = (byte)uVar39;
                  if (bVar19 == 0) break;
                  auVar45 = vblendmps_avx512vl(auVar77._0_16_,auVar83._0_16_);
                  auVar56._0_4_ =
                       (uint)(bVar19 & 1) * auVar45._0_4_ |
                       (uint)!(bool)(bVar19 & 1) * auVar44._0_4_;
                  bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * auVar44._4_4_;
                  bVar12 = (bool)((byte)(uVar39 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * auVar44._8_4_;
                  auVar56._12_4_ =
                       (uVar39 >> 3) * auVar45._12_4_ | (uint)!SUB41(uVar39 >> 3,0) * auVar44._12_4_
                  ;
                  auVar44 = vshufps_avx(auVar56,auVar56,0xb1);
                  auVar44 = vminps_avx(auVar44,auVar56);
                  auVar45 = vshufpd_avx(auVar44,auVar44,1);
                  auVar44 = vminps_avx(auVar45,auVar44);
                  uVar80 = vcmpps_avx512vl(auVar56,auVar44,0);
                  bVar19 = (byte)uVar80 & bVar19;
                  uVar24 = uVar39;
                  if (bVar19 != 0) {
                    uVar24 = (uint)bVar19;
                  }
                  uVar17 = 0;
                  for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                    uVar17 = uVar17 + 1;
                  }
                  uVar21 = (ulong)uVar17;
                } while( true );
              }
            }
            local_2600 = local_2600 + 1;
          } while (local_2600 != local_2608);
        }
        fVar6 = (ray->super_RayK<1>).tfar;
        auVar77 = ZEXT3264(CONCAT428(fVar6,CONCAT424(fVar6,CONCAT420(fVar6,CONCAT416(fVar6,CONCAT412
                                                  (fVar6,CONCAT48(fVar6,CONCAT44(fVar6,fVar6))))))))
        ;
        auVar83 = ZEXT3264(local_23b8);
        auVar85 = ZEXT3264(local_23d8);
        auVar86 = ZEXT3264(local_23f8);
        auVar87 = ZEXT3264(local_2418);
        auVar88 = ZEXT3264(local_2438);
        auVar89 = ZEXT3264(local_2458);
        auVar90 = ZEXT3264(local_2478);
        auVar64 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar91 = ZEXT3264(auVar64);
        auVar64 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
        auVar92 = ZEXT3264(auVar64);
        auVar64 = vmovdqu64_avx512vl(local_2398);
        in_ZMM18 = ZEXT3264(auVar64);
        lVar27 = local_2638;
        lVar26 = local_2620;
        lVar22 = local_2628;
        lVar32 = local_2630;
        unaff_R13 = local_2618;
        lVar36 = local_2640;
        lVar38 = local_2648;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }